

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O1

vector<duckdb::SecretEntry,_true> * __thiscall
duckdb::SecretManager::AllSecrets
          (vector<duckdb::SecretEntry,_true> *__return_storage_ptr__,SecretManager *this,
          CatalogTransaction transaction)

{
  pointer pSVar1;
  pointer pSVar2;
  SecretEntry *it;
  pointer __x;
  _Hash_node_base *p_Var3;
  vector<duckdb::SecretEntry,_true> backend_result;
  vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_> local_48;
  
  InitializeSecrets(this,transaction);
  (__return_storage_ptr__->super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>).
  super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>).
  super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>).
  super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var3 = (this->secret_storages)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      pSVar2 = unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>::
               operator->((unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>
                           *)(p_Var3 + 5));
      (*pSVar2->_vptr_SecretStorage[4])(&local_48,pSVar2,&transaction);
      pSVar1 = local_48.
               super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (__x = local_48.
                 super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != pSVar1; __x = __x + 1) {
        ::std::vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>::push_back
                  (&__return_storage_ptr__->
                    super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>,__x);
      }
      ::std::vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>::~vector(&local_48);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SecretEntry> SecretManager::AllSecrets(CatalogTransaction transaction) {
	InitializeSecrets(transaction);

	vector<SecretEntry> result;

	// Add results from all backends to the result set
	for (const auto &backend : secret_storages) {
		auto backend_result = backend.second->AllSecrets(&transaction);
		for (const auto &it : backend_result) {
			result.push_back(it);
		}
	}

	return result;
}